

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_key.cpp
# Opt level: O2

int CfdDecodeSignatureFromDer
              (void *handle,char *der_signature,char **signature,int *sighash_type,
              bool *sighash_anyone_can_pay)

{
  bool bVar1;
  uint32_t uVar2;
  char *pcVar3;
  CfdException *pCVar4;
  allocator local_91;
  undefined1 local_90 [36];
  SigHashType type;
  ByteData sig;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_48;
  
  cfd::Initialize();
  bVar1 = cfd::capi::IsEmptyString(der_signature);
  if (bVar1) {
    local_90._0_8_ = "cfdcapi_key.cpp";
    local_90._8_4_ = 0x3ac;
    local_90._16_8_ = "CfdDecodeSignatureFromDer";
    cfd::core::logger::warn<>((CfdSourceLocation *)local_90,"der_signature is null or empty.");
    pCVar4 = (CfdException *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string
              ((string *)local_90,"Failed to parameter. der_signature is null or empty.",
               (allocator *)&sig);
    cfd::core::CfdException::CfdException(pCVar4,kCfdIllegalArgumentError,(string *)local_90);
    __cxa_throw(pCVar4,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  if (signature != (char **)0x0) {
    cfd::core::SigHashType::SigHashType(&type);
    std::__cxx11::string::string((string *)local_90,der_signature,&local_91);
    cfd::core::ByteData::ByteData((ByteData *)&local_48,(string *)local_90);
    cfd::core::CryptoUtil::ConvertSignatureFromDer(&sig,(ByteData *)&local_48,&type);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_48);
    std::__cxx11::string::~string((string *)local_90);
    cfd::core::ByteData::GetHex_abi_cxx11_((string *)local_90,&sig);
    pcVar3 = cfd::capi::CreateString((string *)local_90);
    *signature = pcVar3;
    std::__cxx11::string::~string((string *)local_90);
    if (sighash_type != (int *)0x0) {
      uVar2 = cfd::core::SigHashType::GetSigHashFlag(&type);
      *sighash_type = uVar2;
    }
    if (sighash_anyone_can_pay != (bool *)0x0) {
      bVar1 = cfd::core::SigHashType::IsAnyoneCanPay(&type);
      *sighash_anyone_can_pay = bVar1;
    }
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&sig);
    return 0;
  }
  local_90._0_8_ = "cfdcapi_key.cpp";
  local_90._8_4_ = 0x3b2;
  local_90._16_8_ = "CfdDecodeSignatureFromDer";
  cfd::core::logger::warn<>((CfdSourceLocation *)local_90,"signature is null.");
  pCVar4 = (CfdException *)__cxa_allocate_exception(0x30);
  std::__cxx11::string::string
            ((string *)local_90,"Failed to parameter. signature is null.",(allocator *)&sig);
  cfd::core::CfdException::CfdException(pCVar4,kCfdIllegalArgumentError,(string *)local_90);
  __cxa_throw(pCVar4,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
}

Assistant:

int CfdDecodeSignatureFromDer(
    void* handle, const char* der_signature, char** signature,
    int* sighash_type, bool* sighash_anyone_can_pay) {
  try {
    cfd::Initialize();
    if (IsEmptyString(der_signature)) {
      warn(CFD_LOG_SOURCE, "der_signature is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. der_signature is null or empty.");
    }
    if (signature == nullptr) {
      warn(CFD_LOG_SOURCE, "signature is null.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. signature is null.");
    }

    SigHashType type;
    ByteData sig =
        CryptoUtil::ConvertSignatureFromDer(ByteData(der_signature), &type);
    *signature = CreateString(sig.GetHex());
    if (sighash_type) *sighash_type = static_cast<int>(type.GetSigHashFlag());
    if (sighash_anyone_can_pay)
      *sighash_anyone_can_pay = type.IsAnyoneCanPay();

    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    return SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
    return CfdErrorCode::kCfdUnknownError;
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
    return CfdErrorCode::kCfdUnknownError;
  }
}